

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O1

void XXH3_digest_long(XXH64_hash_t *acc,XXH3_state_t *state,uchar *secret)

{
  undefined1 auVar1 [16];
  size_t sVar2;
  long lVar3;
  XXH64_hash_t XVar4;
  XXH64_hash_t XVar5;
  XXH64_hash_t XVar6;
  XXH64_hash_t XVar7;
  XXH64_hash_t XVar8;
  XXH64_hash_t XVar9;
  XXH64_hash_t XVar10;
  __m128i *xinput;
  __m128i *xsecret;
  long lVar11;
  __m128i *xacc;
  ulong __n;
  size_t __n_00;
  uint uVar14;
  uint uVar15;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  size_t nbStripesSoFar;
  XXH3_f_accumulate_512 in_stack_ffffffffffffff80;
  undefined1 auStack_38 [8];
  
  XVar4 = state->acc[0];
  XVar5 = state->acc[1];
  XVar6 = state->acc[2];
  XVar7 = state->acc[3];
  XVar8 = state->acc[4];
  XVar9 = state->acc[5];
  XVar10 = state->acc[7];
  acc[6] = state->acc[6];
  acc[7] = XVar10;
  acc[4] = XVar8;
  acc[5] = XVar9;
  acc[2] = XVar6;
  acc[3] = XVar7;
  *acc = XVar4;
  acc[1] = XVar5;
  __n = (ulong)state->bufferedSize;
  if (__n < 0x40) {
    __n_00 = -__n + 0x40;
    memcpy(&stack0xffffffffffffff88,(void *)((long)state + (0x200 - __n_00)),__n_00);
    memcpy(auStack_38 + -__n,state->buffer,__n);
    sVar2 = state->secretLimit;
    lVar11 = 0;
    do {
      auVar1 = *(undefined1 (*) [16])(&stack0xffffffffffffff88 + lVar11);
      auVar13 = *(undefined1 (*) [16])(secret + lVar11 + (sVar2 - 7)) ^ auVar1;
      uVar15 = auVar13._4_4_;
      auVar17._4_4_ = uVar15;
      auVar17._0_4_ = uVar15;
      auVar17._8_4_ = auVar13._12_4_;
      auVar17._12_4_ = auVar13._12_4_;
      auVar12._0_8_ = auVar1._8_8_;
      auVar12._8_4_ = auVar1._0_4_;
      auVar12._12_4_ = auVar1._4_4_;
      lVar3 = ((long *)((long)acc + lVar11))[1];
      *(long *)((long)acc + lVar11) =
           auVar12._0_8_ + *(long *)((long)acc + lVar11) + (ulong)uVar15 * (ulong)auVar13._0_4_;
      ((long *)((long)acc + lVar11))[1] =
           auVar12._8_8_ + lVar3 + (auVar17._8_8_ & 0xffffffff) * (ulong)auVar13._8_4_;
      lVar11 = lVar11 + 0x10;
    } while (lVar11 != 0x40);
  }
  else {
    XXH3_consumeStripes(acc,(size_t *)&stack0xffffffffffffff88,state->nbStripesPerBlock,
                        state->buffer,(ulong)(state->bufferedSize - 1 >> 6),secret,
                        state->secretLimit,in_stack_ffffffffffffff80,
                        (XXH3_f_scrambleAcc)state->nbStripesSoFar);
    uVar15 = state->bufferedSize;
    sVar2 = state->secretLimit;
    lVar11 = 0;
    do {
      auVar1 = *(undefined1 (*) [16])(state->customSecret + lVar11 + (ulong)uVar15 + 0x80);
      auVar12 = *(undefined1 (*) [16])(secret + lVar11 + (sVar2 - 7)) ^ auVar1;
      uVar14 = auVar12._4_4_;
      auVar16._4_4_ = uVar14;
      auVar16._0_4_ = uVar14;
      auVar16._8_4_ = auVar12._12_4_;
      auVar16._12_4_ = auVar12._12_4_;
      auVar13._0_8_ = auVar1._8_8_;
      auVar13._8_4_ = auVar1._0_4_;
      auVar13._12_4_ = auVar1._4_4_;
      lVar3 = ((long *)((long)acc + lVar11))[1];
      *(long *)((long)acc + lVar11) =
           auVar13._0_8_ + *(long *)((long)acc + lVar11) + (ulong)uVar14 * (ulong)auVar12._0_4_;
      ((long *)((long)acc + lVar11))[1] =
           auVar13._8_8_ + lVar3 + (auVar16._8_8_ & 0xffffffff) * (ulong)auVar12._8_4_;
      lVar11 = lVar11 + 0x10;
    } while (lVar11 != 0x40);
  }
  return;
}

Assistant:

XXH_FORCE_INLINE void
XXH3_digest_long (XXH64_hash_t* acc,
                  const XXH3_state_t* state,
                  const unsigned char* secret)
{
    /*
     * Digest on a local copy. This way, the state remains unaltered, and it can
     * continue ingesting more input afterwards.
     */
    memcpy(acc, state->acc, sizeof(state->acc));
    if (state->bufferedSize >= XXH_STRIPE_LEN) {
        size_t const nbStripes = (state->bufferedSize - 1) / XXH_STRIPE_LEN;
        size_t nbStripesSoFar = state->nbStripesSoFar;
        XXH3_consumeStripes(acc,
                           &nbStripesSoFar, state->nbStripesPerBlock,
                            state->buffer, nbStripes,
                            secret, state->secretLimit,
                            XXH3_accumulate_512, XXH3_scrambleAcc);
        /* last stripe */
        XXH3_accumulate_512(acc,
                            state->buffer + state->bufferedSize - XXH_STRIPE_LEN,
                            secret + state->secretLimit - XXH_SECRET_LASTACC_START);
    } else {  /* bufferedSize < XXH_STRIPE_LEN */
        xxh_u8 lastStripe[XXH_STRIPE_LEN];
        size_t const catchupSize = XXH_STRIPE_LEN - state->bufferedSize;
        XXH_ASSERT(state->bufferedSize > 0);  /* there is always some input buffered */
        memcpy(lastStripe, state->buffer + sizeof(state->buffer) - catchupSize, catchupSize);
        memcpy(lastStripe + catchupSize, state->buffer, state->bufferedSize);
        XXH3_accumulate_512(acc,
                            lastStripe,
                            secret + state->secretLimit - XXH_SECRET_LASTACC_START);
    }
}